

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_spec.cpp
# Opt level: O0

void DWallLightTransfer::DoTransfer(short lightlevel,int target,BYTE flags)

{
  line_t_conflict *plVar1;
  int iVar2;
  line_t_conflict *line;
  FLineIdIterator itr;
  int linenum;
  BYTE flags_local;
  int target_local;
  short lightlevel_local;
  
  itr.start._3_1_ = flags;
  FLineIdIterator::FLineIdIterator((FLineIdIterator *)&line,target);
  while (iVar2 = FLineIdIterator::Next((FLineIdIterator *)&line), plVar1 = lines, -1 < iVar2) {
    itr.searchtag = iVar2;
    if (((itr.start._3_1_ & 1) != 0) && (lines[iVar2].sidedef[0] != (side_t *)0x0)) {
      side_t::SetLight(lines[iVar2].sidedef[0],lightlevel);
    }
    if (((itr.start._3_1_ & 2) != 0) && (plVar1[iVar2].sidedef[1] != (side_t *)0x0)) {
      side_t::SetLight(plVar1[iVar2].sidedef[1],lightlevel);
    }
  }
  return;
}

Assistant:

void DWallLightTransfer::DoTransfer (short lightlevel, int target, BYTE flags)
{
	int linenum;

	FLineIdIterator itr(target);
	while ((linenum = itr.Next()) >= 0)
	{
		line_t *line = &lines[linenum];

		if (flags & WLF_SIDE1 && line->sidedef[0] != NULL)
		{
			line->sidedef[0]->SetLight(lightlevel);
		}

		if (flags & WLF_SIDE2 && line->sidedef[1] != NULL)
		{
			line->sidedef[1]->SetLight(lightlevel);
		}
	}
}